

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O3

Ptr priExpress(TokenReader *tokens)

{
  int iVar1;
  SimpleASTNode *__tmp;
  element_type *extraout_RAX;
  element_type *peVar2;
  invalid_argument *piVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  Ptr PVar5;
  uint local_90;
  Token token;
  SimpleASTNode *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_58 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_48;
  undefined1 local_31;
  
  *(undefined8 *)tokens = 0;
  *(undefined8 *)(tokens + 8) = 0;
  TokenReader::peek();
  if (local_90 == 0x10) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar3,"Invalid arguments, valid variable or literal is required!");
LAB_00109a1a:
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (local_90 < 2) {
    TokenReader::read();
    std::__cxx11::string::operator=((string *)&token,(string *)a_Stack_58);
    if (a_Stack_58[0]._M_pi != &local_48) {
      operator_delete(a_Stack_58[0]._M_pi);
    }
    token.val.field_2._12_4_ = ((int)local_60 == 0) + 1;
    local_60 = (SimpleASTNode *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<SimpleASTNode,std::allocator<SimpleASTNode>,ASTNodeType_const&,std::__cxx11::string_const&>
              (a_Stack_58,&local_60,(allocator<SimpleASTNode> *)&local_31,
               (ASTNodeType *)(token.val.field_2._M_local_buf + 0xc),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&token);
    *(SimpleASTNode **)tokens = local_60;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(tokens + 8) = a_Stack_58[0]._M_pi;
    _Var4._M_pi = extraout_RDX;
  }
  else {
    if (local_90 != 0xe) {
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar3,"Invalid arguments, valid variable or literal is required!");
      goto LAB_00109a1a;
    }
    TokenReader::read();
    std::__cxx11::string::operator=((string *)&token,(string *)a_Stack_58);
    if (a_Stack_58[0]._M_pi != &local_48) {
      operator_delete(a_Stack_58[0]._M_pi);
    }
    express((TokenReader *)&local_60);
    *(SimpleASTNode **)tokens = local_60;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(tokens + 8) = a_Stack_58[0]._M_pi;
    TokenReader::read();
    iVar1 = (int)local_60;
    std::__cxx11::string::operator=((string *)&token,(string *)a_Stack_58);
    _Var4._M_pi = extraout_RDX_00;
    if (a_Stack_58[0]._M_pi != &local_48) {
      operator_delete(a_Stack_58[0]._M_pi);
      _Var4._M_pi = extraout_RDX_01;
    }
    if (iVar1 != 0xf) {
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar3,"Lack of right bracket \")\"");
      __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  peVar2 = (element_type *)&token.val._M_string_length;
  if ((element_type *)token._0_8_ != peVar2) {
    operator_delete((void *)token._0_8_);
    peVar2 = extraout_RAX;
    _Var4._M_pi = extraout_RDX_02;
  }
  PVar5.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  PVar5.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  return (Ptr)PVar5.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static SimpleASTNode::Ptr priExpress(TokenReader& tokens)
{
    //std::cout << "in pri express" << std::endl;
    SimpleASTNode::Ptr node = nullptr;
    Token token = tokens.peek();
    //std::cout << "token type " << token.type << std::endl;
    if (!token.isEmpty()) {
        if (token.type == TokenType::ID_TYPE || token.type == TokenType::INT_LITERAL_TYPE) {
            token = tokens.read();
            node = SimpleASTNode::create((token.type == TokenType::ID_TYPE) ? ASTNodeType::ID :
                   ASTNodeType::INT_LITERAL,  token.val);
        } else if (token.type == TokenType::LBRACKET_TYPE) {
            token = tokens.read();
            node = express(tokens);
            token = tokens.read(); // consume the ")"
            if (token.isEmpty() || token.type != TokenType::RBRACKET_TYPE)
                throw std::invalid_argument("Lack of right bracket \")\"");
        } else {
            throw std::invalid_argument("Invalid arguments, valid variable or literal is required!");
        }
    } else {
        throw std::invalid_argument("Invalid arguments, valid variable or literal is required!");
    }
    return node;
}